

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

bool Internal_IsUnsetFloat(size_t count,float *a)

{
  float fVar1;
  float *pfVar2;
  float x;
  float *e;
  float *a_local;
  size_t count_local;
  
  e = a;
  do {
    if (a + count <= e) {
      return false;
    }
    pfVar2 = e + 1;
    fVar1 = *e;
  } while (((fVar1 != -1.234321e+38) || (NAN(fVar1))) &&
          ((e = pfVar2, fVar1 != 1.234321e+38 || (NAN(fVar1)))));
  return true;
}

Assistant:

static bool Internal_IsUnsetFloat(
  size_t count,
  const float* a
)
{
  const float * e = a + count;
  while (a < e)
  {
    float x = *a++;
    if (ON_UNSET_FLOAT == x || ON_UNSET_POSITIVE_FLOAT == x)
      return true;
  }
  return false;
}